

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_fcall(runtime_type *this,var *a,token_base *b)

{
  token_base *ptVar1;
  _Elt_pointer paVar2;
  bool bVar3;
  int iVar4;
  type_info *ptVar5;
  size_type sVar6;
  token_base **pptVar7;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar8;
  callable *pcVar9;
  runtime_error *this_00;
  long in_RCX;
  tree_type<cs::token_base_*> *tree;
  slot_type **ppsVar10;
  runtime_type *prVar11;
  _Elt_pointer paVar12;
  any *paVar13;
  any *it;
  _Elt_pointer paVar14;
  initializer_list<cs_impl::any> __l;
  var val;
  undefined1 local_98 [40];
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  local_70;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  stack_pointer local_60;
  vector args;
  
  local_98._32_8_ = a;
  ptVar5 = cs_impl::any::type((any *)b);
  bVar3 = std::type_info::operator==(ptVar5,(type_info *)&callable::typeinfo);
  if (bVar3) {
    args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70.
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
    .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              )(CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                )b;
    sVar6 = std::
            deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
            ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                    *)(in_RCX + 0x10));
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::reserve(&args,sVar6);
    ppsVar10 = *(slot_type ***)(in_RCX + 0x20);
    local_98._24_8_ = *(long *)(in_RCX + 0x30);
    local_98._8_8_ = *(long *)(in_RCX + 0x38);
    local_68 = *(flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 **)(in_RCX + 0x40);
    while ((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)ppsVar10 != local_68) {
      val.mDat = (proxy *)*ppsVar10;
      pptVar7 = tree_type<cs::token_base_*>::iterator::data((iterator *)&val);
      ptVar1 = *pptVar7;
      if (ptVar1 == (token_base *)0x0) {
LAB_00157aa3:
        local_60 = (stack_pointer)*ppsVar10;
        parse_expr((runtime_type *)local_98,(iterator *)local_98._32_8_,SUB81(&local_60,0));
        lvalue((var *)local_98);
        std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                  (&args,&val);
        cs_impl::any::recycle(&val);
        prVar11 = (runtime_type *)local_98;
      }
      else {
        iVar4 = (*ptVar1->_vptr_token_base[2])(ptVar1);
        if (iVar4 != 6) goto LAB_00157aa3;
        local_98._0_8_ = ptVar1[1]._vptr_token_base;
        parse_expr((runtime_type *)&val,(iterator *)local_98._32_8_,
                   SUB81((runtime_type *)local_98,0));
        pdVar8 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                           ((any *)&val);
        paVar14 = (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        paVar12 = (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_last;
        local_98._16_8_ =
             (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_start._M_node;
        paVar2 = (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        while (paVar14 != paVar2) {
          lvalue(paVar14);
          std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                    (&args,(any *)local_98);
          cs_impl::any::recycle((any *)local_98);
          paVar14 = paVar14 + 1;
          if (paVar14 == paVar12) {
            paVar14 = *(_Map_pointer)(local_98._16_8_ + 8);
            local_98._16_8_ = local_98._16_8_ + 8;
            paVar12 = paVar14 + 0x40;
          }
        }
        prVar11 = (runtime_type *)&val;
      }
      cs_impl::any::recycle((any *)prVar11);
      ppsVar10 = ppsVar10 + 1;
      if (ppsVar10 == (slot_type **)local_98._24_8_) {
        ppsVar10 = *(slot_type ***)(local_98._8_8_ + 8);
        local_98._8_8_ =
             &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._8_8_)
              ->_M_string_length;
        local_98._24_8_ = ppsVar10 + 0x40;
      }
    }
    pcVar9 = cs_impl::any::const_val<cs::callable>
                       ((any *)local_70.
                               super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                               .
                               super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                               .value);
    std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
    operator()((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                *)this,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar9);
  }
  else {
    ptVar5 = cs_impl::any::type((any *)b);
    bVar3 = std::type_info::operator==(ptVar5,(type_info *)&object_method::typeinfo);
    if (!bVar3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&args,"Unsupported operator operations(Fcall).",(allocator *)&val);
      runtime_error::runtime_error(this_00,(string *)&args);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_70.
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
    .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              )cs_impl::any::const_val<cs::object_method>((any *)b);
    val.mDat = *(proxy **)
                local_70.
                super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                .
                super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                .value;
    if (val.mDat != (proxy *)0x0) {
      (val.mDat)->refcount = (val.mDat)->refcount + 1;
    }
    __l._M_len = 1;
    __l._M_array = &val;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              (&args,__l,(allocator_type *)local_98);
    cs_impl::any::recycle(&val);
    sVar6 = std::
            deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
            ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                    *)(in_RCX + 0x10));
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::reserve(&args,sVar6);
    ppsVar10 = *(slot_type ***)(in_RCX + 0x20);
    local_98._24_8_ = *(long *)(in_RCX + 0x30);
    local_98._8_8_ = *(long *)(in_RCX + 0x38);
    local_68 = *(flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 **)(in_RCX + 0x40);
    while ((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)ppsVar10 != local_68) {
      val.mDat = (proxy *)*ppsVar10;
      pptVar7 = tree_type<cs::token_base_*>::iterator::data((iterator *)&val);
      ptVar1 = *pptVar7;
      if (ptVar1 == (token_base *)0x0) {
LAB_00157c86:
        local_60 = (stack_pointer)*ppsVar10;
        parse_expr((runtime_type *)local_98,(iterator *)local_98._32_8_,SUB81(&local_60,0));
        lvalue((var *)local_98);
        std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                  (&args,&val);
        cs_impl::any::recycle(&val);
        prVar11 = (runtime_type *)local_98;
      }
      else {
        iVar4 = (*ptVar1->_vptr_token_base[2])(ptVar1);
        if (iVar4 != 6) goto LAB_00157c86;
        local_98._0_8_ = ptVar1[1]._vptr_token_base;
        parse_expr((runtime_type *)&val,(iterator *)local_98._32_8_,
                   SUB81((runtime_type *)local_98,0));
        pdVar8 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                           ((any *)&val);
        paVar12 = (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        paVar13 = (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_last;
        local_98._16_8_ =
             (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_start._M_node;
        paVar14 = (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        while (paVar12 != paVar14) {
          lvalue(paVar12);
          std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                    (&args,(any *)local_98);
          cs_impl::any::recycle((any *)local_98);
          paVar12 = paVar12 + 1;
          if (paVar12 == paVar13) {
            paVar12 = *(_Map_pointer)(local_98._16_8_ + 8);
            local_98._16_8_ = local_98._16_8_ + 8;
            paVar13 = paVar12 + 0x40;
          }
        }
        prVar11 = (runtime_type *)&val;
      }
      cs_impl::any::recycle((any *)prVar11);
      ppsVar10 = ppsVar10 + 1;
      if (ppsVar10 == (slot_type **)local_98._24_8_) {
        ppsVar10 = *(slot_type ***)(local_98._8_8_ + 8);
        local_98._8_8_ =
             &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._8_8_)
              ->_M_string_length;
        local_98._24_8_ = ppsVar10 + 0x40;
      }
    }
    pcVar9 = cs_impl::any::const_val<cs::callable>
                       ((var *)((long)local_70.
                                      super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                                      .
                                      super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                                      .value + 8));
    std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
    operator()((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                *)this,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar9);
  }
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&args);
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_fcall(const var &a, token_base *b)
	{
		if (a.type() == typeid(callable)) {
			vector args;
			token_base *ptr = nullptr;
			args.reserve(static_cast<token_arglist *>(b)->get_arglist().size());
			for (auto &tree: static_cast<token_arglist *>(b)->get_arglist()) {
				ptr = tree.root().data();
				if (ptr != nullptr && ptr->get_type() == token_types::expand) {
					var val = parse_expr(static_cast<token_expand *>(ptr)->get_tree().root());
					const auto &arr = val.const_val<array>();
					for (auto &it: arr)
						args.push_back(lvalue(it));
				}
				else
					args.push_back(lvalue(parse_expr(tree.root())));
			}
			return a.const_val<callable>().call(args);
		}
		else if (a.type() == typeid(object_method)) {
			const auto &om = a.const_val<object_method>();
			vector args{om.object};
			token_base *ptr = nullptr;
			args.reserve(static_cast<token_arglist *>(b)->get_arglist().size());
			for (auto &tree: static_cast<token_arglist *>(b)->get_arglist()) {
				ptr = tree.root().data();
				if (ptr != nullptr && ptr->get_type() == token_types::expand) {
					var val = parse_expr(static_cast<token_expand *>(ptr)->get_tree().root());
					const auto &arr = val.const_val<array>();
					for (auto &it: arr)
						args.push_back(lvalue(it));
				}
				else
					args.push_back(lvalue(parse_expr(tree.root())));
			}
			return om.callable.const_val<callable>().call(args);
		}
		else
			throw runtime_error("Unsupported operator operations(Fcall).");
	}